

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseFloatLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  *this)

{
  bool bVar1;
  UnicodeChar UVar2;
  UTF8Reader *pUVar3;
  char *__beg;
  char *__end;
  TokenType TVar4;
  double dVar5;
  bool local_81;
  allocator<char> local_59;
  string local_58;
  bool local_31;
  UnicodeChar local_30;
  bool hasExponent;
  UnicodeChar c;
  bool hasPoint;
  UTF8Reader t;
  int numDigits;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *this_local;
  
  t.data._4_4_ = 0;
  UTF8Reader::UTF8Reader((UTF8Reader *)&c,&this->input);
  while (bVar1 = UTF8Reader::isDigit((UTF8Reader *)&c), bVar1) {
    UTF8Reader::operator++((UTF8Reader *)&c);
    t.data._4_4_ = t.data._4_4_ + 1;
  }
  UVar2 = UTF8Reader::operator*((UTF8Reader *)&c);
  hasExponent = UVar2 == 0x2e;
  if (hasExponent) {
    while( true ) {
      pUVar3 = UTF8Reader::operator++((UTF8Reader *)&c);
      bVar1 = UTF8Reader::isDigit(pUVar3);
      if (!bVar1) break;
      t.data._4_4_ = t.data._4_4_ + 1;
    }
  }
  if (t.data._4_4_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_30 = UTF8Reader::operator*((UTF8Reader *)&c);
    local_81 = local_30 == 0x65 || local_30 == 0x45;
    local_31 = local_81;
    if (local_30 == 0x65 || local_30 == 0x45) {
      pUVar3 = UTF8Reader::operator++((UTF8Reader *)&c);
      local_30 = UTF8Reader::operator*(pUVar3);
      if ((local_30 == 0x2b) || (local_30 == 0x2d)) {
        UTF8Reader::operator++((UTF8Reader *)&c);
      }
      bVar1 = UTF8Reader::isDigit((UTF8Reader *)&c);
      if (!bVar1) {
        return false;
      }
      do {
        pUVar3 = UTF8Reader::operator++((UTF8Reader *)&c);
        bVar1 = UTF8Reader::isDigit(pUVar3);
      } while (bVar1);
    }
    if (((local_31 & 1U) == 0) && ((hasExponent & 1U) == 0)) {
      this_local._7_1_ = false;
    }
    else {
      __beg = UTF8Reader::getAddress(&this->input);
      __end = UTF8Reader::getAddress((UTF8Reader *)&c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>((string *)&local_58,__beg,__end,&local_59);
      dVar5 = std::__cxx11::stod(&local_58,(size_t *)0x0);
      this->literalDoubleValue = dVar5;
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      UTF8Reader::operator=(&this->input,(UTF8Reader *)&c);
      TVar4 = parseSuffixForFloatLiteral(this);
      (this->literalType).text = TVar4.text;
      checkCharacterImmediatelyAfterLiteral(this);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool parseFloatLiteral()
    {
        int numDigits = 0;
        auto t = input;
        while (t.isDigit())  { ++t; ++numDigits; }

        const bool hasPoint = (*t == '.');

        if (hasPoint)
            while ((++t).isDigit())  ++numDigits;

        if (numDigits == 0)
            return false;

        auto c = *t;
        const bool hasExponent = (c == 'e' || c == 'E');

        if (hasExponent)
        {
            c = *++t;
            if (c == '+' || c == '-')  ++t;
            if (! t.isDigit()) return false;
            while ((++t).isDigit()) {}
        }

        if (! (hasExponent || hasPoint))
            return false;

        literalDoubleValue = std::stod (std::string (input.getAddress(), t.getAddress()));
        input = t;
        literalType = parseSuffixForFloatLiteral();
        checkCharacterImmediatelyAfterLiteral();
        return true;
    }